

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerImpl::LoggingConfig(CommissionerImpl *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  anon_class_1_0_00000001 local_67a;
  v10 local_679;
  v10 *local_678;
  char *local_670;
  string local_668;
  allocator local_641;
  string local_640;
  anon_class_1_0_00000001 local_61a;
  v10 local_619;
  v10 *local_618;
  char *local_610;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  anon_class_1_0_00000001 local_5ba;
  v10 local_5b9;
  v10 *local_5b8;
  char *local_5b0;
  string local_5a8;
  allocator local_581;
  string local_580;
  anon_class_1_0_00000001 local_55a;
  v10 local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_558;
  char *local_550;
  string local_548;
  allocator local_521;
  string local_520;
  anon_class_1_0_00000001 local_4fa;
  v10 local_4f9;
  v10 *local_4f8;
  char *local_4f0;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  anon_class_1_0_00000001 local_49a;
  v10 local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  char *local_490;
  string local_488;
  allocator local_451;
  string local_450;
  CommissionerImpl *local_430;
  CommissionerImpl *this_local;
  undefined1 local_418 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  char *local_400;
  string *local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  char *pcStack_3e8;
  string *local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3d8 [2];
  undefined1 local_3c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  char *local_3b0;
  string *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  char *pcStack_398;
  string *local_390;
  v10 *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_380;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> *local_378 [2];
  undefined1 local_368 [16];
  v10 *local_358;
  char *local_350;
  bool *local_348;
  v10 *local_340;
  char *pcStack_338;
  string *local_330;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> *local_328 [2];
  undefined1 local_318 [16];
  v10 *local_308;
  char *local_300;
  Config *local_2f8;
  v10 *local_2f0;
  char *pcStack_2e8;
  string *local_2e0;
  v10 *local_2d8;
  v10 **local_2d0;
  v10 *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_2c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_2b8 [2];
  undefined1 local_2a8 [16];
  v10 *local_298;
  char *local_290;
  uint32_t *local_288;
  v10 *local_280;
  char *pcStack_278;
  string *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_268 [3];
  undefined1 local_250 [16];
  v10 *local_240;
  char *local_238;
  uint32_t *local_230;
  v10 *local_228;
  char *pcStack_220;
  string *local_218;
  v10 *local_210;
  v10 **local_208;
  v10 *local_200;
  v10 **local_1f8;
  v10 *local_1f0;
  v10 **local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1e0;
  undefined1 *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1d0;
  undefined8 local_1c8;
  undefined1 *local_1c0;
  CommissionerImpl **local_1b8;
  undefined1 *local_1b0;
  CommissionerImpl **local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  CommissionerImpl **local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  char *pcStack_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  char *pcStack_150;
  v10 **local_140;
  v10 *local_138;
  char *pcStack_130;
  v10 **local_120;
  v10 *local_118;
  char *pcStack_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_100;
  undefined1 *local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool> **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_10;
  
  local_430 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"config",&local_451);
  LoggingConfig::anon_class_1_0_00000001::operator()(&local_49a);
  local_380 = &local_498;
  local_388 = &local_499;
  bVar1 = ::fmt::v10::operator()(local_388);
  local_490 = (char *)bVar1.size_;
  local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar1.data_;
  ::fmt::v10::detail::
  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
            ();
  local_3a8 = &(this->mConfig).mId;
  local_390 = &local_488;
  local_3a0 = local_498;
  pcStack_398 = local_490;
  local_180 = &local_3a0;
  local_3b8 = local_498;
  local_3b0 = local_490;
  local_178 = local_3b8;
  pcStack_170 = local_3b0;
  local_3d8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_3a8,(v10 *)local_390,local_498);
  local_1d8 = local_3c8;
  local_1e0 = local_3d8;
  local_1c8 = 0xd;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_1e0;
  fmt.size_ = 0xd;
  fmt.data_ = local_3b0;
  local_1d0 = local_1e0;
  local_1c0 = local_1d8;
  local_188 = local_1e0;
  ::fmt::v10::vformat_abi_cxx11_(&local_488,(v10 *)local_3b8,fmt,args);
  Log(kInfo,&local_450,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c0,"config",&local_4c1);
  LoggingConfig::anon_class_1_0_00000001::operator()(&local_4fa);
  local_2d0 = &local_4f8;
  local_2d8 = &local_4f9;
  bVar1 = ::fmt::v10::operator()(local_2d8);
  local_4f0 = (char *)bVar1.size_;
  local_4f8 = (v10 *)bVar1.data_;
  ::fmt::v10::detail::check_format_string<bool_&,_FMT_COMPILE_STRING,_0>();
  local_2f8 = &this->mConfig;
  local_2e0 = &local_4e8;
  local_2f0 = local_4f8;
  pcStack_2e8 = local_4f0;
  local_140 = &local_2f0;
  local_308 = local_4f8;
  local_300 = local_4f0;
  local_138 = local_308;
  pcStack_130 = local_300;
  local_328[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,bool>
                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool>
                             *)local_2f8,(v10 *)local_2e0,(bool *)local_4f8);
  local_f8 = local_318;
  local_100 = local_328;
  local_e8 = 7;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)local_100;
  fmt_00.size_ = 7;
  fmt_00.data_ = local_300;
  local_f0 = local_100;
  local_e0 = local_f8;
  local_d8 = local_100;
  ::fmt::v10::vformat_abi_cxx11_(&local_4e8,local_308,fmt_00,args_00);
  Log(kInfo,&local_4c0,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_520,"config",&local_521);
  LoggingConfig::anon_class_1_0_00000001::operator()(&local_55a);
  local_2c0 = &local_558;
  local_2c8 = &local_559;
  bVar1 = ::fmt::v10::operator()(local_2c8);
  local_550 = (char *)bVar1.size_;
  local_558 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar1.data_;
  ::fmt::v10::detail::
  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
            ();
  local_3f8 = &(this->mConfig).mDomainName;
  local_3e0 = &local_548;
  local_3f0 = local_558;
  pcStack_3e8 = local_550;
  local_160 = &local_3f0;
  local_408 = local_558;
  local_400 = local_550;
  local_158 = local_408;
  pcStack_150 = local_400;
  this_local = (CommissionerImpl *)
               ::fmt::v10::
               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                         ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_3f8,(v10 *)local_3e0,local_558);
  local_1b0 = local_418;
  local_1b8 = &this_local;
  local_1a0 = 0xd;
  args_01.field_1.values_ = in_R9.values_;
  args_01.desc_ = (unsigned_long_long)local_1b8;
  fmt_01.size_ = 0xd;
  fmt_01.data_ = local_400;
  local_1a8 = local_1b8;
  local_198 = local_1b0;
  local_190 = local_1b8;
  ::fmt::v10::vformat_abi_cxx11_(&local_548,(v10 *)local_408,fmt_01,args_01);
  Log(kInfo,&local_520,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,"config",&local_581);
  LoggingConfig::anon_class_1_0_00000001::operator()(&local_5ba);
  local_208 = &local_5b8;
  local_210 = &local_5b9;
  bVar1 = ::fmt::v10::operator()(local_210);
  local_5b0 = (char *)bVar1.size_;
  local_5b8 = (v10 *)bVar1.data_;
  ::fmt::v10::detail::check_format_string<unsigned_int_&,_FMT_COMPILE_STRING,_0>();
  local_230 = &(this->mConfig).mKeepAliveInterval;
  local_218 = &local_5a8;
  local_228 = local_5b8;
  pcStack_220 = local_5b0;
  local_a0 = &local_228;
  local_240 = local_5b8;
  local_238 = local_5b0;
  local_98 = local_240;
  pcStack_90 = local_238;
  local_268[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                             *)local_230,(v10 *)local_218,(uint *)local_5b8);
  local_60 = local_250;
  local_68 = local_268;
  local_50 = 2;
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)local_68;
  fmt_02.size_ = 2;
  fmt_02.data_ = local_238;
  local_58 = local_68;
  local_48 = local_60;
  local_40 = local_68;
  ::fmt::v10::vformat_abi_cxx11_(&local_5a8,local_240,fmt_02,args_02);
  Log(kInfo,&local_580,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,"config",&local_5e1);
  LoggingConfig::anon_class_1_0_00000001::operator()(&local_61a);
  local_1f8 = &local_618;
  local_200 = &local_619;
  bVar1 = ::fmt::v10::operator()(local_200);
  local_610 = (char *)bVar1.size_;
  local_618 = (v10 *)bVar1.data_;
  ::fmt::v10::detail::check_format_string<bool_&,_FMT_COMPILE_STRING,_0>();
  local_348 = &(this->mConfig).mEnableDtlsDebugLogging;
  local_330 = &local_608;
  local_340 = local_618;
  pcStack_338 = local_610;
  local_120 = &local_340;
  local_358 = local_618;
  local_350 = local_610;
  local_118 = local_358;
  pcStack_110 = local_350;
  local_378[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,bool>
                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_bool>
                             *)local_348,(v10 *)local_330,(bool *)local_618);
  local_c8 = local_368;
  local_d0 = local_378;
  local_b8 = 7;
  args_03.field_1.values_ = in_R9.values_;
  args_03.desc_ = (unsigned_long_long)local_d0;
  fmt_03.size_ = 7;
  fmt_03.data_ = local_350;
  local_c0 = local_d0;
  local_b0 = local_c8;
  local_a8 = local_d0;
  ::fmt::v10::vformat_abi_cxx11_(&local_608,local_358,fmt_03,args_03);
  Log(kInfo,&local_5e0,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"config",&local_641);
  LoggingConfig::anon_class_1_0_00000001::operator()(&local_67a);
  local_1e8 = &local_678;
  local_1f0 = &local_679;
  bVar1 = ::fmt::v10::operator()(local_1f0);
  local_670 = (char *)bVar1.size_;
  local_678 = (v10 *)bVar1.data_;
  ::fmt::v10::detail::check_format_string<unsigned_int_&,_FMT_COMPILE_STRING,_0>();
  local_288 = &(this->mConfig).mMaxConnectionNum;
  local_270 = &local_668;
  local_280 = local_678;
  pcStack_278 = local_670;
  local_80 = &local_280;
  local_298 = local_678;
  local_290 = local_670;
  local_78 = local_298;
  pcStack_70 = local_290;
  local_2b8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                             *)local_288,(v10 *)local_270,(uint *)local_678);
  local_30 = local_2a8;
  local_38 = local_2b8;
  local_20 = 2;
  args_04.field_1.values_ = in_R9.values_;
  args_04.desc_ = (unsigned_long_long)local_38;
  fmt_04.size_ = 2;
  fmt_04.data_ = local_290;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(&local_668,local_298,fmt_04,args_04);
  Log(kInfo,&local_640,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  return;
}

Assistant:

void CommissionerImpl::LoggingConfig()
{
    LOG_INFO(LOG_REGION_CONFIG, "Id = {}", mConfig.mId);
    LOG_INFO(LOG_REGION_CONFIG, "enable CCM = {}", mConfig.mEnableCcm);
    LOG_INFO(LOG_REGION_CONFIG, "domain name = {}", mConfig.mDomainName);
    LOG_INFO(LOG_REGION_CONFIG, "keep alive interval = {}", mConfig.mKeepAliveInterval);
    LOG_INFO(LOG_REGION_CONFIG, "enable DTLS debug logging = {}", mConfig.mEnableDtlsDebugLogging);
    LOG_INFO(LOG_REGION_CONFIG, "maximum connection number = {}", mConfig.mMaxConnectionNum);

    // Do not logging credentials
}